

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.h
# Opt level: O2

BasicTypeInfo<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_> *
dap::TypeInfo::
create<dap::BasicTypeInfo<std::vector<dap::Variable,std::allocator<dap::Variable>>>,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  BasicTypeInfo<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_> *this;
  
  this = (BasicTypeInfo<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_> *)
         operator_new(0x28);
  BasicTypeInfo<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_>::BasicTypeInfo
            (this,args);
  deleteOnExit((TypeInfo *)this);
  return this;
}

Assistant:

static T* create(ARGS&&... args) {
    auto typeinfo = new T(std::forward<ARGS>(args)...);
    deleteOnExit(typeinfo);
    return typeinfo;
  }